

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

uint If_DsdManCheckPrime(If_DsdMan_t *p,int iFirst,uint uMaskNot,If_DsdObj_t *pObj,int nSuppAll,
                        int LutSize,int fDerive,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vSets;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int pSSizes [12];
  int pFirsts [12];
  int local_98 [12];
  int local_68 [14];
  
  uVar12 = *(uint *)&pObj->field_0x4;
  uVar7 = (ulong)uVar12;
  if ((0x17ffffff < uVar7) && ((uVar12 & 7) == 6)) {
    uVar4 = pObj->Id;
    if (((long)(int)uVar4 < 0) || ((p->vTruths).nSize <= (int)uVar4)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar11 = (p->vTruths).pArray[(int)uVar4];
    if (-1 < (long)iVar11) {
      uVar6 = (ulong)(uVar12 >> 0x1b);
      if (iVar11 < p->vTtDecs[uVar6]->nSize) {
        vSets = (Vec_Int_t *)p->vTtDecs[uVar6]->pArray[iVar11];
        if (fVerbose != 0) {
          putchar(10);
          Dau_DecPrintSets(vSets,uVar12 >> 0x1b);
          uVar7 = (ulong)*(uint *)&pObj->field_0x4;
          if (*(uint *)&pObj->field_0x4 < 0x18000000) {
            __assert_fail("If_DsdObjFaninNum(pObj) > 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                          ,0x766,
                          "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                         );
          }
        }
        if ((int)((uint)(uVar7 >> 3) & 0x1f) <= LutSize) {
          __assert_fail("If_DsdObjSuppSize(pObj) > LutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                        ,0x767,
                        "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                       );
        }
        If_DsdManGetSuppSizes(p,pObj,local_98);
        iVar11 = ~nSuppAll + LutSize + (*(uint *)&pObj->field_0x4 >> 3 & 0x1f);
        if (LutSize <= iVar11) {
          __assert_fail("LimitOut < LutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                        ,0x76a,
                        "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                       );
        }
        iVar3 = vSets->nSize;
        if (0 < iVar3) {
          lVar10 = 0;
          do {
            iVar1 = vSets->pArray[lVar10];
            lVar5 = 0;
            iVar8 = 0;
            iVar9 = 0;
            uVar7 = uVar6;
            do {
              switch(iVar1 >> ((byte)lVar5 & 0x1f) & 3) {
              case 0:
                iVar9 = iVar9 + *(int *)((long)local_98 + lVar5 * 2);
                break;
              case 1:
                iVar8 = iVar8 + *(int *)((long)local_98 + lVar5 * 2);
                break;
              case 2:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                              ,0x77a,
                              "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                             );
              case 3:
                iVar2 = *(int *)((long)local_98 + lVar5 * 2);
                iVar8 = iVar8 + iVar2;
                iVar9 = iVar9 + iVar2;
              }
              if ((LutSize < iVar8) || (iVar11 < iVar9)) {
                if ((int)uVar7 != 0) goto LAB_0042ca06;
                break;
              }
              lVar5 = lVar5 + 2;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
            if (fDerive == 0) {
              return 0xffffffff;
            }
            If_DsdManComputeFirstArray
                      (p,(int *)(pObj + 1),*(uint *)&pObj->field_0x4 >> 0x1b,local_68);
            lVar5 = 0;
            uVar7 = 0;
            uVar12 = 0;
            do {
              iVar3 = 0;
              switch(iVar1 >> ((byte)lVar5 & 0x1f) & 3) {
              case 2:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                              ,0x78d,
                              "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                             );
              case 3:
                iVar3 = 1;
              case 1:
                uVar4 = If_DsdSign(p,pObj,(int)uVar7,*(int *)((long)local_68 + lVar5 * 2) + iFirst,
                                   iVar3);
                uVar12 = uVar12 | uVar4;
              }
              uVar7 = uVar7 + 1;
              lVar5 = lVar5 + 2;
            } while (uVar6 != uVar7);
            if ((uMaskNot & uVar12) == 0) {
              return uVar12;
            }
            iVar3 = vSets->nSize;
LAB_0042ca06:
            lVar10 = lVar10 + 1;
          } while (lVar10 < iVar3);
        }
        return 0;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

unsigned If_DsdManCheckPrime( If_DsdMan_t * p, int iFirst, unsigned uMaskNot, If_DsdObj_t * pObj, int nSuppAll, int LutSize, int fDerive, int fVerbose )
{
    int i, v, set, LimitOut, SizeIn, SizeOut, pSSizes[DAU_MAX_VAR], pFirsts[DAU_MAX_VAR];
    int truthId = If_DsdObjTruthId(p, pObj);
    int nFans = If_DsdObjFaninNum(pObj);
    Vec_Int_t * vSets = (Vec_Int_t *)Vec_PtrEntry(p->vTtDecs[pObj->nFans], truthId);
if ( fVerbose )
printf( "\n" );
if ( fVerbose )
Dau_DecPrintSets( vSets, nFans );
    assert( If_DsdObjFaninNum(pObj) > 2 );
    assert( If_DsdObjSuppSize(pObj) > LutSize );
    If_DsdManGetSuppSizes( p, pObj, pSSizes );
    LimitOut = LutSize - (nSuppAll - If_DsdObjSuppSize(pObj) + 1);
    assert( LimitOut < LutSize );
    Vec_IntForEachEntry( vSets, set, i )
    {
        SizeIn = SizeOut = 0;
        for ( v = 0; v < nFans; v++ )
        {
            int Value = ((set >> (v << 1)) & 3);
            if ( Value == 0 )
                SizeOut += pSSizes[v];
            else if ( Value == 1 )
                SizeIn += pSSizes[v];
            else if ( Value == 3 )
            {
                SizeIn += pSSizes[v];
                SizeOut += pSSizes[v];
            }
            else assert( 0 );
            if ( SizeIn > LutSize || SizeOut > LimitOut )
                break;
        }
        if ( v == nFans )
        {
            unsigned uRes = 0;
            if ( !fDerive )
                return ~0;
            If_DsdManComputeFirst( p, pObj, pFirsts );
            for ( v = 0; v < nFans; v++ )
            {
                int Value = ((set >> (v << 1)) & 3);
                if ( Value == 0 )
                {}
                else if ( Value == 1 )
                    uRes |= If_DsdSign(p, pObj, v, iFirst + pFirsts[v], 0);
                else if ( Value == 3 )
                    uRes |= If_DsdSign(p, pObj, v, iFirst + pFirsts[v], 1);
                else assert( 0 );
            }
            if ( uRes & uMaskNot )
                continue;
            return uRes;
        }
    }
    return 0;
}